

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  size_t sVar1;
  float fVar2;
  float x0;
  float y0;
  ImVec2 IVar3;
  ushort uVar4;
  ushort uVar5;
  ImFont *pIVar6;
  uint uVar7;
  int iVar8;
  uint *puVar9;
  ulong uVar10;
  int off_y_1;
  long lVar11;
  uchar *puVar12;
  uint uVar13;
  int off_x;
  ImFontAtlasCustomRect *pIVar14;
  uint uVar15;
  char *pcVar16;
  long lVar17;
  int off_y;
  int iVar18;
  uint uVar19;
  size_t __n;
  long lVar20;
  int iVar23;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  int iVar29;
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  long local_48;
  
  iVar8 = atlas->PackIdMouseCursors;
  pIVar14 = (atlas->CustomRects).Data;
  lVar11 = (long)atlas->TexWidth;
  uVar10 = (ulong)pIVar14[iVar8].X;
  if ((atlas->Flags & 2) == 0) {
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      puVar9 = atlas->TexPixelsRGBA32 + (ulong)pIVar14[iVar8].X + lVar11 * (ulong)pIVar14[iVar8].Y;
      pcVar16 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
      ;
      iVar18 = 0;
      do {
        lVar11 = 0;
        do {
          puVar9[lVar11] = -(uint)(pcVar16[lVar11] == '.');
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x7a);
        iVar18 = iVar18 + 1;
        puVar9 = puVar9 + atlas->TexWidth;
        pcVar16 = pcVar16 + 0x7a;
      } while (iVar18 != 0x1b);
      puVar9 = atlas->TexPixelsRGBA32 +
               uVar10 + 0x7b + (long)atlas->TexWidth * (ulong)pIVar14[iVar8].Y;
      pcVar16 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
      ;
      iVar18 = 0;
      do {
        lVar11 = 0;
        do {
          puVar9[lVar11] = -(uint)(pcVar16[lVar11] == 'X');
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x7a);
        iVar18 = iVar18 + 1;
        puVar9 = puVar9 + atlas->TexWidth;
        pcVar16 = pcVar16 + 0x7a;
      } while (iVar18 != 0x1b);
    }
    else {
      puVar12 = atlas->TexPixelsAlpha8 + lVar11 * (ulong)pIVar14[iVar8].Y + uVar10;
      pcVar16 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
      ;
      iVar18 = 0;
      do {
        lVar11 = 0;
        do {
          puVar12[lVar11] = -(pcVar16[lVar11] == '.');
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x7a);
        iVar18 = iVar18 + 1;
        puVar12 = puVar12 + atlas->TexWidth;
        pcVar16 = pcVar16 + 0x7a;
      } while (iVar18 != 0x1b);
      puVar12 = atlas->TexPixelsAlpha8 +
                (long)atlas->TexWidth * (ulong)pIVar14[iVar8].Y + uVar10 + 0x7b;
      pcVar16 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
      ;
      iVar18 = 0;
      do {
        lVar11 = 0;
        do {
          puVar12[lVar11] = -(pcVar16[lVar11] == 'X');
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x7a);
        iVar18 = iVar18 + 1;
        puVar12 = puVar12 + atlas->TexWidth;
        pcVar16 = pcVar16 + 0x7a;
      } while (iVar18 != 0x1b);
    }
  }
  else {
    lVar17 = (ulong)pIVar14[iVar8].Y * lVar11 + uVar10;
    lVar20 = (long)(int)lVar17;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      lVar11 = (long)(atlas->TexWidth + (int)lVar17);
      atlas->TexPixelsRGBA32[lVar11 + 1] = 0xffffffff;
      atlas->TexPixelsRGBA32[lVar11] = 0xffffffff;
      atlas->TexPixelsRGBA32[lVar20 + 1] = 0xffffffff;
      atlas->TexPixelsRGBA32[lVar20] = 0xffffffff;
    }
    else {
      atlas->TexPixelsAlpha8[lVar20 + lVar11 + 1] = 0xff;
      atlas->TexPixelsAlpha8[lVar20 + lVar11] = 0xff;
      atlas->TexPixelsAlpha8[lVar17 + 1] = 0xff;
      atlas->TexPixelsAlpha8[lVar17] = 0xff;
    }
  }
  uVar7._0_2_ = pIVar14[iVar8].X;
  uVar7._2_2_ = pIVar14[iVar8].Y;
  IVar3 = atlas->TexUvScale;
  (atlas->TexUvWhitePixel).x = IVar3.x * ((float)(uVar7 & 0xffff) + 0.5);
  (atlas->TexUvWhitePixel).y = IVar3.y * ((float)(uVar7 >> 0x10) + 0.5);
  if ((atlas->Flags & 4) == 0) {
    pIVar14 = (atlas->CustomRects).Data + atlas->PackIdLines;
    local_48 = 0;
    iVar8 = 0;
    __n = 0;
    auVar30 = _DAT_0024f090;
    do {
      uVar4 = pIVar14->Width;
      iVar18 = (int)__n;
      uVar7 = (uint)uVar4 - iVar18;
      uVar13 = uVar7 >> 1;
      uVar15 = iVar18 + uVar13;
      uVar19 = (uint)uVar4;
      if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
        puVar9 = atlas->TexPixelsRGBA32;
        uVar10 = (ulong)(((uint)pIVar14->Y + iVar18) * atlas->TexWidth + (uint)pIVar14->X);
        if (1 < uVar7) {
          uVar7 = iVar8 + (uint)uVar4 >> 1;
          lVar11 = (ulong)(uVar7 + (uVar7 == 0)) - 1;
          auVar21._8_4_ = (int)lVar11;
          auVar21._0_8_ = lVar11;
          auVar21._12_4_ = (int)((ulong)lVar11 >> 0x20);
          lVar11 = 0;
          auVar26 = _DAT_0026fee0;
          auVar24 = _DAT_0026fed0;
          do {
            auVar25 = auVar21 ^ auVar30;
            auVar28 = auVar26 ^ auVar30;
            iVar23 = auVar25._4_4_;
            if ((bool)(~(iVar23 < auVar28._4_4_ ||
                        auVar25._0_4_ < auVar28._0_4_ && auVar28._4_4_ == iVar23) & 1)) {
              *(undefined4 *)((long)puVar9 + lVar11 + uVar10 * 4) = 0xffffff;
            }
            if (auVar28._12_4_ <= auVar25._12_4_ &&
                (auVar28._8_4_ <= auVar25._8_4_ || auVar28._12_4_ != auVar25._12_4_)) {
              *(undefined4 *)((long)puVar9 + lVar11 + uVar10 * 4 + 4) = 0xffffff;
            }
            iVar29 = SUB164(auVar24 ^ auVar30,4);
            if (iVar29 <= iVar23 &&
                (iVar29 != iVar23 || SUB164(auVar24 ^ auVar30,0) <= auVar25._0_4_)) {
              *(undefined4 *)((long)puVar9 + lVar11 + uVar10 * 4 + 8) = 0xffffff;
              *(undefined4 *)((long)puVar9 + lVar11 + uVar10 * 4 + 0xc) = 0xffffff;
            }
            lVar20 = auVar26._8_8_;
            auVar26._0_8_ = auVar26._0_8_ + 4;
            auVar26._8_8_ = lVar20 + 4;
            lVar20 = auVar24._8_8_;
            auVar24._0_8_ = auVar24._0_8_ + 4;
            auVar24._8_8_ = lVar20 + 4;
            lVar11 = lVar11 + 0x10;
          } while ((ulong)(uVar7 + (uVar7 == 0) + 3 & 0xfffffffc) << 2 != lVar11);
        }
        if (__n != 0) {
          memset(puVar9 + uVar10 + uVar13,0xff,__n * 4);
          auVar30 = _DAT_0024f090;
        }
        if (uVar19 != uVar15) {
          uVar7 = uVar19 + iVar8 >> 1;
          uVar15 = (uVar19 + iVar8) - uVar7;
          lVar11 = (ulong)(uVar15 + (uVar15 == 0)) - 1;
          auVar22._8_4_ = (int)lVar11;
          auVar22._0_8_ = lVar11;
          auVar22._12_4_ = (int)((ulong)lVar11 >> 0x20);
          lVar11 = local_48 + (ulong)uVar7 * 4 + uVar10 * 4;
          auVar22 = auVar22 ^ auVar30;
          uVar10 = 0;
          auVar25 = _DAT_0026fee0;
          auVar28 = _DAT_0026fed0;
          do {
            auVar26 = auVar25 ^ auVar30;
            iVar23 = auVar22._4_4_;
            if ((bool)(~(auVar26._4_4_ == iVar23 && auVar22._0_4_ < auVar26._0_4_ ||
                        iVar23 < auVar26._4_4_) & 1)) {
              *(undefined4 *)((long)puVar9 + uVar10 + lVar11) = 0xffffff;
            }
            if ((auVar26._12_4_ != auVar22._12_4_ || auVar26._8_4_ <= auVar22._8_4_) &&
                auVar26._12_4_ <= auVar22._12_4_) {
              *(undefined4 *)((long)puVar9 + uVar10 + lVar11 + 4) = 0xffffff;
            }
            iVar29 = SUB164(auVar28 ^ auVar30,4);
            if (iVar29 <= iVar23 &&
                (iVar29 != iVar23 || SUB164(auVar28 ^ auVar30,0) <= auVar22._0_4_)) {
              *(undefined4 *)((long)puVar9 + uVar10 + lVar11 + 8) = 0xffffff;
              *(undefined4 *)((long)puVar9 + uVar10 + lVar11 + 0xc) = 0xffffff;
            }
            lVar20 = auVar25._8_8_;
            auVar25._0_8_ = auVar25._0_8_ + 4;
            auVar25._8_8_ = lVar20 + 4;
            lVar20 = auVar28._8_8_;
            auVar28._0_8_ = auVar28._0_8_ + 4;
            auVar28._8_8_ = lVar20 + 4;
            uVar10 = uVar10 + 0x10;
          } while ((((ulong)uVar15 + (ulong)((ulong)uVar15 == 0)) * 4 + 0xc & 0x7fffffff0) != uVar10
                  );
        }
      }
      else {
        puVar12 = atlas->TexPixelsAlpha8 +
                  (((uint)pIVar14->Y + iVar18) * atlas->TexWidth + (uint)pIVar14->X);
        if (1 < uVar7) {
          memset(puVar12,0,(ulong)(uVar13 + (uVar13 == 0)));
          auVar30 = _DAT_0024f090;
        }
        if (__n != 0) {
          memset(puVar12 + uVar13,0xff,__n);
          auVar30 = _DAT_0024f090;
        }
        if (uVar19 != uVar15) {
          memset(puVar12 + uVar13 + __n,0,(ulong)((uVar19 - uVar15) + (uint)(uVar19 - uVar15 == 0)))
          ;
          auVar30 = _DAT_0024f090;
        }
      }
      uVar4 = pIVar14->X;
      uVar5 = pIVar14->Y;
      fVar2 = (atlas->TexUvScale).x;
      fVar27 = (atlas->TexUvScale).y;
      sVar1 = __n + 1;
      atlas->TexUvLines[__n].x = (float)((uVar4 + uVar13) - 1) * fVar2;
      fVar27 = ((float)(int)(uVar5 + 1 + iVar18) * fVar27 +
               (float)(int)((uint)uVar5 + iVar18) * fVar27) * 0.5;
      atlas->TexUvLines[__n].y = fVar27;
      atlas->TexUvLines[__n].z = fVar2 * (float)((uint)uVar4 + (int)sVar1 + uVar13);
      atlas->TexUvLines[__n].w = fVar27;
      iVar8 = iVar8 + -1;
      local_48 = local_48 + 4;
      __n = sVar1;
    } while (sVar1 != 0x40);
  }
  if (0 < (atlas->CustomRects).Size) {
    lVar11 = 0;
    lVar20 = 0;
    do {
      pIVar14 = (atlas->CustomRects).Data;
      pIVar6 = *(ImFont **)((long)&pIVar14->Font + lVar11);
      if ((pIVar6 != (ImFont *)0x0) &&
         (iVar8 = *(int *)((long)&pIVar14->GlyphID + lVar11), iVar8 != 0)) {
        uVar7 = (uint)*(ushort *)((long)&pIVar14->X + lVar11);
        fVar2 = (atlas->TexUvScale).x;
        fVar27 = (atlas->TexUvScale).y;
        uVar15 = (uint)*(ushort *)((long)&pIVar14->Y + lVar11);
        uVar19 = (uint)*(ushort *)((long)&pIVar14->Width + lVar11);
        uVar13 = (uint)*(ushort *)((long)&pIVar14->Height + lVar11);
        x0 = *(float *)((long)&(pIVar14->GlyphOffset).x + lVar11);
        y0 = *(float *)((long)&(pIVar14->GlyphOffset).y + lVar11);
        ImFont::AddGlyph(pIVar6,(ImFontConfig *)0x0,(ImWchar)iVar8,x0,y0,(float)uVar19 + x0,
                         (float)uVar13 + y0,(float)uVar7 * fVar2,(float)uVar15 * fVar27,
                         (float)(uVar7 + uVar19) * fVar2,(float)(uVar15 + uVar13) * fVar27,
                         *(float *)((long)&pIVar14->GlyphAdvanceX + lVar11));
      }
      lVar20 = lVar20 + 1;
      lVar11 = lVar11 + 0x20;
    } while (lVar20 < (atlas->CustomRects).Size);
  }
  if (0 < (atlas->Fonts).Size) {
    lVar11 = 0;
    do {
      pIVar6 = (atlas->Fonts).Data[lVar11];
      if (pIVar6->DirtyLookupTables == true) {
        ImFont::BuildLookupTable(pIVar6);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (atlas->Fonts).Size);
  }
  atlas->TexReady = true;
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL || atlas->TexPixelsRGBA32 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    atlas->TexReady = true;
}